

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<float> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<float>
          (optional<float> *__return_storage_ptr__,PrimVar *this)

{
  optional<float> in_RAX;
  optional<float> local_18;
  
  local_18 = in_RAX;
  get_value<float>(&local_18,this);
  __return_storage_ptr__->has_value_ = local_18.has_value_;
  if (local_18.has_value_ == true) {
    __return_storage_ptr__->contained = local_18.contained;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }